

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O0

Type * slang::ast::getIndexedType
                 (Compilation *compilation,ASTContext *context,Type *valueType,SourceRange exprRange
                 ,SourceRange valueRange,bool isRangeSelect)

{
  SourceRange range;
  SourceRange range_00;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  bool bVar1;
  Type *pTVar2;
  SourceLocation in_RCX;
  int *in_RDX;
  Compilation *in_RDI;
  SourceLocation in_R8;
  byte in_R9B;
  Diagnostic *diag_1;
  Diagnostic *diag;
  DiagCode code;
  Type *elemType;
  Type *ct;
  Compilation *in_stack_ffffffffffffff38;
  Diagnostic *in_stack_ffffffffffffff40;
  Diagnostic *this;
  SourceLocation this_00;
  SourceLocation in_stack_ffffffffffffff50;
  ASTContext *in_stack_ffffffffffffff58;
  SourceLocation in_stack_ffffffffffffff60;
  SourceLocation in_stack_ffffffffffffff68;
  DiagCode in_stack_ffffffffffffff74;
  Type *in_stack_ffffffffffffff98;
  Type *local_8;
  
  this_00 = (SourceLocation)&stack0x00000008;
  pTVar2 = Type::getCanonicalType((Type *)in_stack_ffffffffffffff40);
  bVar1 = Type::isArray((Type *)in_stack_ffffffffffffff38);
  if (bVar1) {
    local_8 = Type::getArrayElementType((Type *)this_00);
    if ((*in_RDX == 0xc) && (bVar1 = Type::isSigned((Type *)in_stack_ffffffffffffff40), bVar1)) {
      local_8 = Type::makeUnsigned((Type *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
  }
  else if (((pTVar2->super_Symbol).kind == StringType) && ((in_R9B & 1) == 0)) {
    local_8 = Compilation::getByteType(in_RDI);
  }
  else {
    bVar1 = Type::isIntegral((Type *)in_stack_ffffffffffffff40);
    if (bVar1) {
      bVar1 = Type::isScalar((Type *)0xbe39d0);
      if (bVar1) {
        sourceRange_00.endLoc = in_R8;
        sourceRange_00.startLoc = in_RCX;
        ASTContext::addDiag(in_stack_ffffffffffffff58,(DiagCode)0x370007,sourceRange_00);
        range_00.endLoc = *(SourceLocation *)this_00;
        range_00.startLoc = this_00;
        Diagnostic::operator<<(in_stack_ffffffffffffff40,range_00);
        local_8 = Compilation::getErrorType(in_RDI);
      }
      else {
        bVar1 = Type::isFourState(in_stack_ffffffffffffff98);
        if (bVar1) {
          local_8 = Compilation::getLogicType(in_RDI);
        }
        else {
          local_8 = Compilation::getBitType(in_RDI);
        }
      }
    }
    else {
      bVar1 = Type::isError((Type *)0xbe38ef);
      if (!bVar1) {
        if ((in_R9B & 1) == 0) {
          this = (Diagnostic *)&slang::diag::BadIndexExpression;
        }
        else {
          this = (Diagnostic *)&slang::diag::BadSliceType;
        }
        sourceRange.endLoc = in_stack_ffffffffffffff68;
        sourceRange.startLoc = in_stack_ffffffffffffff60;
        ASTContext::addDiag(in_stack_ffffffffffffff58,in_stack_ffffffffffffff74,sourceRange);
        pTVar2 = *(Type **)((long)this_00 + 8);
        range.endLoc = in_stack_ffffffffffffff50;
        range.startLoc = this_00;
        Diagnostic::operator<<(this,range);
        operator<<((Diagnostic *)in_RCX,pTVar2);
      }
      local_8 = Compilation::getErrorType(in_RDI);
    }
  }
  return local_8;
}

Assistant:

static const Type& getIndexedType(Compilation& compilation, const ASTContext& context,
                                  const Type& valueType, SourceRange exprRange,
                                  SourceRange valueRange, bool isRangeSelect) {
    const Type& ct = valueType.getCanonicalType();
    if (ct.isArray()) {
        auto& elemType = *ct.getArrayElementType();
        if (valueType.kind == SymbolKind::PackedArrayType && valueType.isSigned())
            return elemType.makeUnsigned(compilation);

        return elemType;
    }
    else if (ct.kind == SymbolKind::StringType && !isRangeSelect) {
        return compilation.getByteType();
    }
    else if (!ct.isIntegral()) {
        if (!ct.isError()) {
            auto code = isRangeSelect ? diag::BadSliceType : diag::BadIndexExpression;
            auto& diag = context.addDiag(code, exprRange);
            diag << valueRange;
            diag << valueType;
        }
        return compilation.getErrorType();
    }
    else if (ct.isScalar()) {
        auto& diag = context.addDiag(diag::CannotIndexScalar, exprRange);
        diag << valueRange;
        return compilation.getErrorType();
    }
    else if (ct.isFourState()) {
        return compilation.getLogicType();
    }
    else {
        return compilation.getBitType();
    }
}